

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O2

QDataStream * __thiscall QDataStream::operator>>(QDataStream *this,bool *i)

{
  long in_FS_OFFSET;
  qint8 v;
  qint8 local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = -0x56;
  operator>>(this,&local_21);
  *i = local_21 != '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &QDataStream::operator>>(bool &i)
{
    qint8 v;
    *this >> v;
    i = !!v;
    return *this;
}